

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_cargo_zero_start_bool_option(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  int b;
  char *args [1];
  cargo_t local_20;
  int local_14;
  char *local_10;
  
  iVar1 = cargo_init(&local_20,0,"program");
  if (iVar1 == 0) {
    local_14 = 0;
    local_10 = "--beta";
    iVar1 = cargo_add_option(local_20,0,"--beta",(char *)0x0,"b");
    if (iVar1 == 0) {
      iVar1 = cargo_parse(local_20,0,0,1,&local_10);
      if (iVar1 == 0) {
        pcVar2 = (char *)0x0;
        if (local_14 != 1) {
          pcVar2 = "Expected b == 1";
        }
      }
      else {
        pcVar2 = "Parse failed";
      }
    }
    else {
      pcVar2 = "Failed to add option";
    }
    cargo_destroy(&local_20);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_cargo_zero_start_bool_option)
{
    int b = 0;
    char *args[] = { "--beta" };

    ret |= cargo_add_option(cargo, 0, "--beta", NULL, "b", &b);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 0, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed");
    cargo_assert(b == 1, "Expected b == 1");

    _TEST_CLEANUP();
}